

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateByteSize
          (MessageGenerator *this,Printer *printer)

{
  Options *options;
  vector<int,_std::allocator<int>_> *fields;
  OneofDescriptor **ppOVar1;
  anon_unknown_0 *this_00;
  pointer ppFVar2;
  cpp *this_01;
  FieldDescriptor *field;
  long lVar3;
  undefined1 auVar4 [8];
  bool bVar5;
  int iVar6;
  int iVar7;
  uint32 n;
  uint uVar8;
  FieldGenerator *pFVar9;
  __normal_iterator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_*,_std::vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>_>
  __first;
  LogMessage *pLVar10;
  string *from;
  ulong uVar11;
  long lVar12;
  int cached_has_word_index_00;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *pFVar13;
  FieldDescriptor *field_00;
  vector<int,_std::allocator<int>_> *has_bit_indices;
  AlphaNum *a;
  ulong uVar14;
  char *format_00;
  Descriptor *descriptor;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_02;
  Printer *in_R8;
  stringpiece_ssize_type in_R9;
  pointer ppFVar15;
  undefined8 *puVar16;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  Hex HVar17;
  StringPiece has_bits_var;
  undefined1 local_1f8 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  Printer *local_1c0;
  undefined1 local_1b8 [8];
  Iterator __end4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> masks_for_has_bits;
  undefined1 local_170 [8];
  ColdChunkSkipper cold_skipper;
  Iterator __end3;
  string chunk_mask_str;
  Iterator __begin4;
  undefined1 auStack_b8 [8];
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  chunks;
  undefined1 local_88 [8];
  Formatter format;
  int local_34 [2];
  int cached_has_word_index;
  
  local_88 = (undefined1  [8])printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&format,&(this->variables_)._M_t);
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x48) == '\x01') {
    cold_skipper.access_info_map_ = (AccessInfoMap *)&cold_skipper;
    cold_skipper.chunks_._0_4_ = 0;
    cold_skipper.has_bit_indices_ = (vector<int,_std::allocator<int>_> *)0x0;
    cold_skipper.variables_._M_t._M_impl._0_8_ = 0;
    cold_skipper.cold_threshold_ = (double)cold_skipper.access_info_map_;
    SetUnknkownFieldsVariable
              (this->descriptor_,&this->options_,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_170);
    Formatter::AddMap((Formatter *)local_88,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_170);
    Formatter::operator()<>
              ((Formatter *)local_88,
               "size_t $classname$::ByteSizeLong() const {\n// @@protoc_insertion_point(message_set_byte_size_start:$full_name$)\n  size_t total_size = _extensions_.MessageSetByteSize();\n  if ($have_unknown_fields$) {\n    total_size += ::$proto_ns$::internal::\n        ComputeUnknownMessageSetItemsSize($unknown_fields$);\n  }\n  int cached_size = ::$proto_ns$::internal::ToCachedSize(total_size);\n  SetCachedSize(cached_size);\n  return total_size;\n}\n"
              );
    this_02 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_170;
  }
  else {
    if (1 < this->num_required_fields_) {
      Formatter::operator()<>
                ((Formatter *)local_88,
                 "size_t $classname$::RequiredFieldsByteSizeFallback() const {\n// @@protoc_insertion_point(required_fields_byte_size_fallback_start:$full_name$)\n"
                );
      google::protobuf::io::Printer::Indent();
      Formatter::operator()<>((Formatter *)local_88,"size_t total_size = 0;\n");
      ppFVar2 = (this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pFVar13 = extraout_RDX;
      for (ppFVar15 = (this->optimized_order_).
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppFVar15 != ppFVar2;
          ppFVar15 = ppFVar15 + 1) {
        this_01 = (cpp *)*ppFVar15;
        if (*(int *)(this_01 + 0x3c) == 2) {
          FieldName_abi_cxx11_((string *)local_170,this_01,pFVar13);
          Formatter::operator()
                    ((Formatter *)local_88,"\nif (_internal_has_$1$()) {\n",(string *)local_170);
          std::__cxx11::string::~string((string *)local_170);
          google::protobuf::io::Printer::Indent();
          PrintFieldComment<google::protobuf::FieldDescriptor>
                    ((Formatter *)local_88,(FieldDescriptor *)this_01);
          pFVar9 = FieldGeneratorMap::get(&this->field_generators_,(FieldDescriptor *)this_01);
          (*pFVar9->_vptr_FieldGenerator[0x14])(pFVar9,printer);
          google::protobuf::io::Printer::Outdent();
          Formatter::operator()<>((Formatter *)local_88,"}\n");
          pFVar13 = extraout_RDX_00;
        }
      }
      Formatter::operator()<>((Formatter *)local_88,"\nreturn total_size;\n");
      google::protobuf::io::Printer::Outdent();
      Formatter::operator()<>((Formatter *)local_88,"}\n");
    }
    Formatter::operator()<>
              ((Formatter *)local_88,
               "size_t $classname$::ByteSizeLong() const {\n// @@protoc_insertion_point(message_byte_size_start:$full_name$)\n"
              );
    google::protobuf::io::Printer::Indent();
    Formatter::operator()<>((Formatter *)local_88,"size_t total_size = 0;\n\n");
    descriptor = this->descriptor_;
    if (0 < *(int *)(descriptor + 0x7c)) {
      Formatter::operator()<>((Formatter *)local_88,"total_size += _extensions_.ByteSize();\n\n");
      descriptor = this->descriptor_;
    }
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&vars;
    vars._M_t._M_impl._0_4_ = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    options = &this->options_;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    SetUnknkownFieldsVariable
              (descriptor,options,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_1f8);
    Formatter::AddMap((Formatter *)local_88,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_1f8);
    if (this->num_required_fields_ < 2) {
      ppFVar2 = (this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppFVar15 = (this->optimized_order_).
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppFVar15 != ppFVar2;
          ppFVar15 = ppFVar15 + 1) {
        pFVar13 = *ppFVar15;
        if (*(int *)(pFVar13 + 0x3c) == 2) {
          PrintFieldComment<google::protobuf::FieldDescriptor>((Formatter *)local_88,pFVar13);
          FieldName_abi_cxx11_((string *)local_170,(cpp *)pFVar13,field_00);
          Formatter::operator()
                    ((Formatter *)local_88,"if (_internal_has_$1$()) {\n",(string *)local_170);
          std::__cxx11::string::~string((string *)local_170);
          google::protobuf::io::Printer::Indent();
          pFVar9 = FieldGeneratorMap::get(&this->field_generators_,pFVar13);
          (*pFVar9->_vptr_FieldGenerator[0x14])(pFVar9,printer);
          google::protobuf::io::Printer::Outdent();
          Formatter::operator()<>((Formatter *)local_88,"}\n");
        }
      }
    }
    else {
      RequiredFieldsBitMask
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__end4.descriptor,this);
      StringPiece::StringPiece
                ((StringPiece *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count,"_has_bits_")
      ;
      has_bits_var.length_ = in_R9;
      has_bits_var.ptr_ = (char *)local_1c0;
      (anonymous_namespace)::ConditionalToCheckBitmasks_abi_cxx11_
                ((string *)local_170,&__end4.descriptor,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1,
                 (bool)(undefined1)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 has_bits_var);
      Formatter::operator()
                ((Formatter *)local_88,"if ($1$) {  // All required fields are present.\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170);
      std::__cxx11::string::~string((string *)local_170);
      google::protobuf::io::Printer::Indent();
      ppFVar2 = (this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppFVar15 = (this->optimized_order_).
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppFVar15 != ppFVar2;
          ppFVar15 = ppFVar15 + 1) {
        pFVar13 = *ppFVar15;
        if (*(int *)(pFVar13 + 0x3c) == 2) {
          PrintFieldComment<google::protobuf::FieldDescriptor>((Formatter *)local_88,pFVar13);
          pFVar9 = FieldGeneratorMap::get(&this->field_generators_,pFVar13);
          (*pFVar9->_vptr_FieldGenerator[0x14])(pFVar9,printer);
          Formatter::operator()<>((Formatter *)local_88,"\n");
        }
      }
      google::protobuf::io::Printer::Outdent();
      Formatter::operator()<>
                ((Formatter *)local_88,
                 "} else {\n  total_size += RequiredFieldsByteSizeFallback();\n}\n");
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&__end4.descriptor);
      in_R8 = local_1c0;
    }
    chunks.
    super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_b8 = (undefined1  [8])0x0;
    chunks.
    super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ppFVar2 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppFVar15 = (this->optimized_order_).
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppFVar15 != ppFVar2;
        ppFVar15 = ppFVar15 + 1) {
      pFVar13 = *ppFVar15;
      local_170 = (undefined1  [8])pFVar13;
      if ((auStack_b8 ==
           (undefined1  [8])
           chunks.
           super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start) ||
         (field = chunks.
                  super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[-1].
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1],
         *(int *)(field + 0x3c) != *(int *)(pFVar13 + 0x3c))) {
LAB_0020885c:
        std::
        vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
        ::emplace_back<>((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                          *)auStack_b8);
      }
      else {
        iVar6 = HasByteIndex(this,field);
        iVar7 = HasByteIndex(this,pFVar13);
        if (iVar6 != iVar7) goto LAB_0020885c;
      }
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::push_back(chunks.
                  super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + -1,(value_type *)local_170);
    }
    __first = std::
              __remove_if<__gnu_cxx::__normal_iterator<std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>*,std::vector<std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>,std::allocator<std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>>>,__gnu_cxx::__ops::_Iter_pred<bool(*)(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&)>>
                        ((__normal_iterator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_*,_std::vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>_>
                          )auStack_b8,
                         (__normal_iterator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_*,_std::vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>_>
                          )chunks.
                           super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                         (_Iter_pred<bool_(*)(const_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_&)>
                          )0x20d0d7);
    std::
    vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
    ::erase((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
             *)auStack_b8,(const_iterator)__first._M_current,
            (const_iterator)
            chunks.
            super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start);
    fields = &this->has_bit_indices_;
    anon_unknown_0::ColdChunkSkipper::ColdChunkSkipper
              ((ColdChunkSkipper *)local_170,options,
               (vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                *)auStack_b8,fields,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    local_34[0] = -1;
    Formatter::operator()<>
              ((Formatter *)local_88,
               "$uint32$ cached_has_bits = 0;\n// Prevent compiler warnings about cached_has_bits being unused\n(void) cached_has_bits;\n\n"
              );
    uVar11 = 0;
    ppOVar1 = &__end4.descriptor;
    while( true ) {
      auVar4 = auStack_b8;
      if ((ulong)(((long)chunks.
                         super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start - (long)auStack_b8) / 0x18) <=
          uVar11) break;
      ppFVar15 = (((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)((long)auStack_b8 + uVar11 * 0x18))->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      from = (string *)
             ((long)(((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       *)((long)auStack_b8 + uVar11 * 0x18))->
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar15);
      if (from < (string *)0x9) {
        format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
      }
      else {
        iVar6 = HasWordIndex(this,*ppFVar15);
        format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
             CONCAT31((int3)((uint)iVar6 >> 8),iVar6 != -1);
      }
      std::__cxx11::string::string((string *)ppOVar1,"",(allocator *)&__end3.descriptor);
      anon_unknown_0::ColdChunkSkipper::OnStartChunk
                ((ColdChunkSkipper *)local_170,(int)printer,cached_has_word_index_00,from,in_R8);
      this_00 = (anon_unknown_0 *)((long)auVar4 + uVar11 * 0x18);
      std::__cxx11::string::~string((string *)ppOVar1);
      if (format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_1_ != '\0') {
        n = anon_unknown_0::GenChunkMask
                      (this_00,(vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                *)fields,has_bit_indices);
        HVar17.value = (ulong)n;
        HVar17._8_8_ = 8;
        google::protobuf::strings::AlphaNum::AlphaNum((AlphaNum *)ppOVar1,HVar17);
        StrCat_abi_cxx11_((string *)&__end3.descriptor,(protobuf *)ppOVar1,a);
        uVar8 = anon_unknown_0::popcnt(n);
        if ((int)uVar8 < 2) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)ppOVar1,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0xf10);
          pLVar10 = (LogMessage *)
                    google::protobuf::internal::LogMessage::operator<<
                              ((LogMessage *)ppOVar1,"CHECK failed: (2) <= (popcnt(chunk_mask)): ");
          google::protobuf::internal::LogFinisher::operator=
                    ((LogFinisher *)&cold_skipper.limit_chunk_,pLVar10);
LAB_00208a57:
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)ppOVar1);
        }
        else if (8 < uVar8) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)ppOVar1,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0xf11);
          pLVar10 = (LogMessage *)
                    google::protobuf::internal::LogMessage::operator<<
                              ((LogMessage *)ppOVar1,"CHECK failed: (8) >= (popcnt(chunk_mask)): ");
          google::protobuf::internal::LogFinisher::operator=
                    ((LogFinisher *)&cold_skipper.limit_chunk_,pLVar10);
          goto LAB_00208a57;
        }
        iVar6 = local_34[0];
        iVar7 = HasWordIndex(this,(FieldDescriptor *)**(undefined8 **)this_00);
        if (iVar6 != iVar7) {
          local_34[0] = HasWordIndex(this,(FieldDescriptor *)**(undefined8 **)this_00);
          Formatter::operator()
                    ((Formatter *)local_88,"cached_has_bits = _has_bits_[$1$];\n",local_34);
        }
        Formatter::operator()
                  ((Formatter *)local_88,"if (cached_has_bits & 0x$1$u) {\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &__end3.descriptor);
        google::protobuf::io::Printer::Indent();
        std::__cxx11::string::~string((string *)&__end3.descriptor);
      }
      for (uVar14 = 0; uVar14 < (ulong)(*(long *)(this_00 + 8) - *(long *)this_00 >> 3);
          uVar14 = uVar14 + 1) {
        pFVar13 = *(FieldDescriptor **)(*(long *)this_00 + uVar14 * 8);
        pFVar9 = FieldGeneratorMap::get(&this->field_generators_,pFVar13);
        PrintFieldComment<google::protobuf::FieldDescriptor>((Formatter *)local_88,pFVar13);
        iVar6 = *(int *)(pFVar13 + 0x3c);
        if (iVar6 == 3) {
          bVar5 = false;
        }
        else {
          bVar5 = HasHasbit(pFVar13);
          if (bVar5) {
            bVar5 = true;
            anon_unknown_0::PrintPresenceCheck
                      ((Formatter *)local_88,pFVar13,fields,(Printer *)local_34,(int *)in_R8);
          }
          else {
            std::__cxx11::string::string((string *)ppOVar1,"this->",(allocator *)&__end3.descriptor)
            ;
            bVar5 = anon_unknown_0::EmitFieldNonDefaultCondition(printer,(string *)ppOVar1,pFVar13);
            std::__cxx11::string::~string((string *)ppOVar1);
          }
        }
        (*pFVar9->_vptr_FieldGenerator[0x14])(pFVar9,printer);
        if (bVar5 != false) {
          google::protobuf::io::Printer::Outdent();
          Formatter::operator()<>((Formatter *)local_88,"}\n\n");
        }
        if (iVar6 == 3) {
          Formatter::operator()<>((Formatter *)local_88,"\n");
        }
      }
      if (format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_1_ != '\0') {
        google::protobuf::io::Printer::Outdent();
        Formatter::operator()<>((Formatter *)local_88,"}\n");
      }
      bVar5 = anon_unknown_0::ColdChunkSkipper::OnEndChunk
                        ((ColdChunkSkipper *)local_170,(int)uVar11,printer);
      if (bVar5) {
        local_34[0] = -1;
      }
      uVar11 = uVar11 + 1;
    }
    __end3._0_8_ = this->descriptor_;
    __end3.descriptor._0_4_ = 0;
    cold_skipper.limit_chunk_ = *(int *)(__end3._0_8_ + 0x70);
    ppOVar1 = &__end4.descriptor;
    chunk_mask_str._M_dataplus._M_p = (pointer)__end3._0_8_;
    while( true ) {
      bVar5 = operator!=((Iterator *)&__end3.descriptor,(Iterator *)&cold_skipper.limit_chunk_);
      if (!bVar5) break;
      lVar12 = (long)(int)__end3.descriptor;
      lVar3 = *(long *)(chunk_mask_str._M_dataplus._M_p + 0x30);
      Formatter::operator()
                ((Formatter *)local_88,"switch ($1$_case()) {\n",
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (lVar3 + lVar12 * 0x30));
      google::protobuf::io::Printer::Indent();
      puVar16 = (undefined8 *)(lVar3 + lVar12 * 0x30);
      chunk_mask_str.field_2._8_4_ = 0;
      local_1b8._0_4_ = *(undefined4 *)(puVar16 + 3);
      __end4._0_8_ = puVar16;
      while( true ) {
        bVar5 = operator!=((Iterator *)((long)&chunk_mask_str.field_2 + 8),(Iterator *)local_1b8);
        if (!bVar5) break;
        pFVar13 = *(FieldDescriptor **)(puVar16[4] + (long)(int)chunk_mask_str.field_2._8_4_ * 8);
        PrintFieldComment<google::protobuf::FieldDescriptor>((Formatter *)local_88,pFVar13);
        UnderscoresToCamelCase((string *)ppOVar1,*(string **)pFVar13,true);
        Formatter::operator()
                  ((Formatter *)local_88,"case k$1$: {\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ppOVar1);
        std::__cxx11::string::~string((string *)ppOVar1);
        google::protobuf::io::Printer::Indent();
        pFVar9 = FieldGeneratorMap::get(&this->field_generators_,pFVar13);
        (*pFVar9->_vptr_FieldGenerator[0x14])(pFVar9,printer);
        Formatter::operator()<>((Formatter *)local_88,"break;\n");
        google::protobuf::io::Printer::Outdent();
        Formatter::operator()<>((Formatter *)local_88,"}\n");
        chunk_mask_str.field_2._8_4_ = chunk_mask_str.field_2._8_4_ + 1;
      }
      ToUpper((string *)ppOVar1,(string *)*puVar16);
      Formatter::operator()
                ((Formatter *)local_88,"case $1$_NOT_SET: {\n  break;\n}\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ppOVar1);
      std::__cxx11::string::~string((string *)ppOVar1);
      google::protobuf::io::Printer::Outdent();
      Formatter::operator()<>((Formatter *)local_88,"}\n");
      __end3.descriptor._0_4_ = (int)__end3.descriptor + 1;
    }
    if (this->num_weak_fields_ != 0) {
      Formatter::operator()<>
                ((Formatter *)local_88,"total_size += _weak_field_map_.ByteSizeLong();\n");
    }
    Formatter::operator()<>
              ((Formatter *)local_88,"if (PROTOBUF_PREDICT_FALSE($have_unknown_fields$)) {\n");
    bVar5 = UseUnknownFieldSet(*(FileDescriptor **)(this->descriptor_ + 0x10),options);
    format_00 = "  total_size += $unknown_fields$.size();\n";
    if (bVar5) {
      format_00 = 
      "  return ::$proto_ns$::internal::ComputeUnknownFieldsSize(\n      _internal_metadata_, total_size, &_cached_size_);\n"
      ;
    }
    Formatter::operator()<>((Formatter *)local_88,format_00);
    Formatter::operator()<>((Formatter *)local_88,"}\n");
    Formatter::operator()<>
              ((Formatter *)local_88,
               "int cached_size = ::$proto_ns$::internal::ToCachedSize(total_size);\nSetCachedSize(cached_size);\nreturn total_size;\n"
              );
    google::protobuf::io::Printer::Outdent();
    Formatter::operator()<>((Formatter *)local_88,"}\n");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&cold_skipper.cold_threshold_);
    std::
    vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
    ::~vector((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
               *)auStack_b8);
    this_02 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_1f8;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(this_02);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&format);
  return;
}

Assistant:

void MessageGenerator::GenerateByteSize(io::Printer* printer) {
  Formatter format(printer, variables_);

  if (descriptor_->options().message_set_wire_format()) {
    // Special-case MessageSet.
    std::map<std::string, std::string> vars;
    SetUnknkownFieldsVariable(descriptor_, options_, &vars);
    format.AddMap(vars);
    format(
        "size_t $classname$::ByteSizeLong() const {\n"
        "// @@protoc_insertion_point(message_set_byte_size_start:$full_name$)\n"
        "  size_t total_size = _extensions_.MessageSetByteSize();\n"
        "  if ($have_unknown_fields$) {\n"
        "    total_size += ::$proto_ns$::internal::\n"
        "        ComputeUnknownMessageSetItemsSize($unknown_fields$);\n"
        "  }\n"
        "  int cached_size = "
        "::$proto_ns$::internal::ToCachedSize(total_size);\n"
        "  SetCachedSize(cached_size);\n"
        "  return total_size;\n"
        "}\n");
    return;
  }

  if (num_required_fields_ > 1) {
    // Emit a function (rarely used, we hope) that handles the required fields
    // by checking for each one individually.
    format(
        "size_t $classname$::RequiredFieldsByteSizeFallback() const {\n"
        "// @@protoc_insertion_point(required_fields_byte_size_fallback_start:"
        "$full_name$)\n");
    format.Indent();
    format("size_t total_size = 0;\n");
    for (auto field : optimized_order_) {
      if (field->is_required()) {
        format(
            "\n"
            "if (_internal_has_$1$()) {\n",
            FieldName(field));
        format.Indent();
        PrintFieldComment(format, field);
        field_generators_.get(field).GenerateByteSize(printer);
        format.Outdent();
        format("}\n");
      }
    }
    format(
        "\n"
        "return total_size;\n");
    format.Outdent();
    format("}\n");
  }

  format(
      "size_t $classname$::ByteSizeLong() const {\n"
      "// @@protoc_insertion_point(message_byte_size_start:$full_name$)\n");
  format.Indent();
  format(
      "size_t total_size = 0;\n"
      "\n");

  if (descriptor_->extension_range_count() > 0) {
    format(
        "total_size += _extensions_.ByteSize();\n"
        "\n");
  }

  std::map<std::string, std::string> vars;
  SetUnknkownFieldsVariable(descriptor_, options_, &vars);
  format.AddMap(vars);

  // Handle required fields (if any).  We expect all of them to be
  // present, so emit one conditional that checks for that.  If they are all
  // present then the fast path executes; otherwise the slow path executes.
  if (num_required_fields_ > 1) {
    // The fast path works if all required fields are present.
    const std::vector<uint32> masks_for_has_bits = RequiredFieldsBitMask();
    format("if ($1$) {  // All required fields are present.\n",
           ConditionalToCheckBitmasks(masks_for_has_bits));
    format.Indent();
    // Oneof fields cannot be required, so optimized_order_ contains all of the
    // fields that we need to potentially emit.
    for (auto field : optimized_order_) {
      if (!field->is_required()) continue;
      PrintFieldComment(format, field);
      field_generators_.get(field).GenerateByteSize(printer);
      format("\n");
    }
    format.Outdent();
    format(
        "} else {\n"  // the slow path
        "  total_size += RequiredFieldsByteSizeFallback();\n"
        "}\n");
  } else {
    // num_required_fields_ <= 1: no need to be tricky
    for (auto field : optimized_order_) {
      if (!field->is_required()) continue;
      PrintFieldComment(format, field);
      format("if (_internal_has_$1$()) {\n", FieldName(field));
      format.Indent();
      field_generators_.get(field).GenerateByteSize(printer);
      format.Outdent();
      format("}\n");
    }
  }

  std::vector<std::vector<const FieldDescriptor*>> chunks = CollectFields(
      optimized_order_,
      [&](const FieldDescriptor* a, const FieldDescriptor* b) -> bool {
        return a->label() == b->label() && HasByteIndex(a) == HasByteIndex(b);
      });

  // Remove chunks with required fields.
  chunks.erase(std::remove_if(chunks.begin(), chunks.end(), IsRequired),
               chunks.end());

  ColdChunkSkipper cold_skipper(options_, chunks, has_bit_indices_, kColdRatio);
  int cached_has_word_index = -1;

  format(
      "$uint32$ cached_has_bits = 0;\n"
      "// Prevent compiler warnings about cached_has_bits being unused\n"
      "(void) cached_has_bits;\n\n");

  for (int chunk_index = 0; chunk_index < chunks.size(); chunk_index++) {
    const std::vector<const FieldDescriptor*>& chunk = chunks[chunk_index];
    const bool have_outer_if =
        chunk.size() > 1 && HasWordIndex(chunk[0]) != kNoHasbit;
    cold_skipper.OnStartChunk(chunk_index, cached_has_word_index, "", printer);

    if (have_outer_if) {
      // Emit an if() that will let us skip the whole chunk if none are set.
      uint32 chunk_mask = GenChunkMask(chunk, has_bit_indices_);
      std::string chunk_mask_str =
          StrCat(strings::Hex(chunk_mask, strings::ZERO_PAD_8));

      // Check (up to) 8 has_bits at a time if we have more than one field in
      // this chunk.  Due to field layout ordering, we may check
      // _has_bits_[last_chunk * 8 / 32] multiple times.
      GOOGLE_DCHECK_LE(2, popcnt(chunk_mask));
      GOOGLE_DCHECK_GE(8, popcnt(chunk_mask));

      if (cached_has_word_index != HasWordIndex(chunk.front())) {
        cached_has_word_index = HasWordIndex(chunk.front());
        format("cached_has_bits = _has_bits_[$1$];\n", cached_has_word_index);
      }
      format("if (cached_has_bits & 0x$1$u) {\n", chunk_mask_str);
      format.Indent();
    }

    // Go back and emit checks for each of the fields we processed.
    for (int j = 0; j < chunk.size(); j++) {
      const FieldDescriptor* field = chunk[j];
      const FieldGenerator& generator = field_generators_.get(field);
      bool have_enclosing_if = false;
      bool need_extra_newline = false;

      PrintFieldComment(format, field);

      if (field->is_repeated()) {
        // No presence check is required.
        need_extra_newline = true;
      } else if (HasHasbit(field)) {
        PrintPresenceCheck(format, field, has_bit_indices_, printer,
                           &cached_has_word_index);
        have_enclosing_if = true;
      } else {
        // Without field presence: field is serialized only if it has a
        // non-default value.
        have_enclosing_if =
            EmitFieldNonDefaultCondition(printer, "this->", field);
      }

      generator.GenerateByteSize(printer);

      if (have_enclosing_if) {
        format.Outdent();
        format(
            "}\n"
            "\n");
      }
      if (need_extra_newline) {
        format("\n");
      }
    }

    if (have_outer_if) {
      format.Outdent();
      format("}\n");
    }

    if (cold_skipper.OnEndChunk(chunk_index, printer)) {
      // Reset here as it may have been updated in just closed if statement.
      cached_has_word_index = -1;
    }
  }

  // Fields inside a oneof don't use _has_bits_ so we count them in a separate
  // pass.
  for (auto oneof : OneOfRange(descriptor_)) {
    format("switch ($1$_case()) {\n", oneof->name());
    format.Indent();
    for (auto field : FieldRange(oneof)) {
      PrintFieldComment(format, field);
      format("case k$1$: {\n", UnderscoresToCamelCase(field->name(), true));
      format.Indent();
      if (IsFieldUsed(field, options_)) {
        field_generators_.get(field).GenerateByteSize(printer);
      }
      format("break;\n");
      format.Outdent();
      format("}\n");
    }
    format(
        "case $1$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        ToUpper(oneof->name()));
    format.Outdent();
    format("}\n");
  }

  if (num_weak_fields_) {
    // TagSize + MessageSize
    format("total_size += _weak_field_map_.ByteSizeLong();\n");
  }

  format("if (PROTOBUF_PREDICT_FALSE($have_unknown_fields$)) {\n");
  if (UseUnknownFieldSet(descriptor_->file(), options_)) {
    // We go out of our way to put the computation of the uncommon path of
    // unknown fields in tail position. This allows for better code generation
    // of this function for simple protos.
    format(
        "  return ::$proto_ns$::internal::ComputeUnknownFieldsSize(\n"
        "      _internal_metadata_, total_size, &_cached_size_);\n");
  } else {
    format("  total_size += $unknown_fields$.size();\n");
  }
  format("}\n");

  // We update _cached_size_ even though this is a const method.  Because
  // const methods might be called concurrently this needs to be atomic
  // operations or the program is undefined.  In practice, since any concurrent
  // writes will be writing the exact same value, normal writes will work on
  // all common processors. We use a dedicated wrapper class to abstract away
  // the underlying atomic. This makes it easier on platforms where even relaxed
  // memory order might have perf impact to replace it with ordinary loads and
  // stores.
  format(
      "int cached_size = ::$proto_ns$::internal::ToCachedSize(total_size);\n"
      "SetCachedSize(cached_size);\n"
      "return total_size;\n");

  format.Outdent();
  format("}\n");
}